

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

string * __thiscall leveldb::DecompressAllocator::get_abi_cxx11_(DecompressAllocator *this)

{
  bool bVar1;
  reference pvVar2;
  string *in_RDI;
  lock_guard<std::mutex> lock;
  string *buffer;
  string *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)this_00,(mutex_type *)in_RDI);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_ffffffffffffffe0);
  if (!bVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
    std::__cxx11::string::operator=((string *)in_RDI,(string *)pvVar2);
    std::__cxx11::string::clear();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x11d844);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11d853);
  return this_00;
}

Assistant:

std::string DecompressAllocator::get() {
  std::string buffer;
  std::lock_guard<std::mutex> lock(mutex);

  if (!stack.empty()) {
    buffer = std::move(stack.back());
    buffer.clear();
    stack.pop_back();
  }
  return buffer;
}